

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  connectdata *conn;
  connectdata *pcVar4;
  char *pcVar5;
  sockaddr *psVar6;
  curl_trc_feat *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  _Bool _Var11;
  ushort uVar12;
  CURLcode CVar13;
  uint uVar14;
  int iVar15;
  resolve_t rVar16;
  CURLproxycode CVar17;
  socks_state *sx;
  long lVar18;
  size_t sVar19;
  Curl_dns_entry *pCVar20;
  ssize_t sVar21;
  uchar uVar22;
  int code;
  Curl_addrinfo *pCVar23;
  ulong uVar24;
  char *pcVar25;
  ulong uVar26;
  connect_t cVar27;
  Curl_dns_entry *dns;
  char *local_a0;
  size_t local_98;
  char *local_90;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar13 = CURLE_OK;
    _Var11 = true;
    goto LAB_0015664f;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar15 = cf->sockindex;
  CVar13 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar13 != CURLE_OK) {
    return CVar13;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar27 = sx->state;
  if (cVar27 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar18 = 0xf0;
    if (((((ulong)conn->bits & 1) == 0) && (lVar18 = 0x98, (SUB84(conn->bits,0) >> 8 & 1) == 0)) &&
       (lVar18 = 0x68, iVar15 == 1)) {
      sx->hostname = conn->secondaryhostname;
      if (((ulong)conn->bits & 1) == 0) {
LAB_00156685:
        uVar14 = (uint)conn->secondary_port;
      }
      else {
LAB_0015668e:
        uVar14 = (conn->http_proxy).port;
      }
    }
    else {
      sx->hostname = *(char **)((long)&(conn->cpool_node)._list + lVar18);
      if (((ulong)conn->bits & 1) != 0) goto LAB_0015668e;
      if (iVar15 == 1) goto LAB_00156685;
      if ((SUB84(conn->bits,0) >> 9 & 1) == 0) {
        uVar14 = conn->remote_port;
      }
      else {
        uVar14 = conn->conn_to_port;
      }
    }
    sx->remote_port = uVar14;
    uVar8 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar9 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar10 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar8;
    *(undefined4 *)&sx->proxy_password = uVar9;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar10;
    cVar27 = CONNECT_SOCKS_INIT;
  }
  pcVar4 = cf->conn;
  bVar3 = (pcVar4->socks_proxy).proxytype;
  switch(bVar3) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar25 = sx->hostname;
    local_a0 = (char *)(ulong)bVar3;
    sVar19 = strlen(pcVar25);
    bVar3 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    if (0xf < cVar27 - CONNECT_SOCKS_INIT) {
switchD_001567f0_caseD_5:
      if (((data->set).field_0x8cd & 0x10) == 0) {
        CVar17 = CURLPX_OK;
      }
      else {
        pcVar7 = (data->state).feat;
        CVar17 = CURLPX_OK;
        if ((pcVar7 == (curl_trc_feat *)0x0) || (0 < pcVar7->log_level)) {
          Curl_infof(data,"SOCKS5 request granted.");
          CVar17 = CURLPX_OK;
        }
      }
      goto LAB_00157b09;
    }
    puVar1 = sx->buffer;
    switch(cVar27) {
    case CONNECT_SOCKS_INIT:
      if (((((ulong)pcVar4->bits & 1) != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar25);
      }
      if (((char)local_a0 == '\x05') || (sVar19 < 0x100)) {
        local_98 = sVar19;
        if ((((bVar3 & 0xfa) != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar3);
        }
        if ((bVar3 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
          sx->buffer[0] = '\x05';
          sVar21 = 3;
          lVar18 = 0x12;
          uVar22 = '\0';
LAB_001570c8:
          sx->buffer[lVar18 + -0x10] = uVar22;
        }
        else {
          pcVar25 = sx->proxy_user;
          sx->buffer[0] = '\x05';
          sx->buffer[2] = '\0';
          if (pcVar25 != (char *)0x0) {
            sVar21 = 4;
            uVar22 = '\x02';
            lVar18 = 0x13;
            goto LAB_001570c8;
          }
          sVar21 = 3;
        }
        sx->buffer[1] = (char)sVar21 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar21;
        CVar17 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar17 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            sVar19 = local_98;
            if (sx->state != CONNECT_SOCKS_READ) {
              sx->state = CONNECT_SOCKS_READ;
            }
            goto switchD_001567f0_caseD_3;
          }
          CVar17 = CURLPX_OK;
        }
      }
      else {
        Curl_failf(data,
                   "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                  );
        CVar17 = CURLPX_LONG_HOSTNAME;
      }
      goto LAB_00157b09;
    case CONNECT_SOCKS_SEND:
      CVar17 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar17 != CURLPX_OK) goto LAB_00157b09;
      if (sx->outstanding == 0) goto switchD_001567f0_caseD_3;
      goto LAB_00157bc3;
    case CONNECT_SOCKS_READ_INIT:
switchD_001567f0_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
      break;
    case CONNECT_GSSAPI_INIT:
      goto switchD_001567f0_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_001567f0_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_001567f0_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_001567f0_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_001567f0_caseD_9;
    case CONNECT_RESOLVING:
      pCVar20 = Curl_fetch_addr(data,pcVar25,sx->remote_port);
      dns = pCVar20;
      if (pCVar20 == (Curl_dns_entry *)0x0) {
        CVar13 = Curl_resolv_check(data,&dns);
        pCVar20 = dns;
        if (dns == (Curl_dns_entry *)0x0) {
          CVar17 = CURLPX_RESOLVE_HOST;
          if (CVar13 == CURLE_OK) {
            CVar17 = CURLPX_OK;
          }
          goto LAB_00157b09;
        }
      }
      else {
        (data->state).async.dns = pCVar20;
        puVar2 = &(data->state).async.field_0x28;
        *puVar2 = *puVar2 | 1;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
        }
      }
      goto LAB_00157723;
    case CONNECT_RESOLVED:
      pCVar23 = (Curl_addrinfo *)0x0;
      goto LAB_00157727;
    case CONNECT_RESOLVE_REMOTE:
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      lVar18 = 3;
      if ((char)local_a0 == '\x05') goto LAB_001578f3;
      goto LAB_0015757d;
    case CONNECT_REQ_SEND:
      lVar18 = 0;
      goto LAB_001578f3;
    case CONNECT_REQ_SENDING:
      goto switchD_001567f0_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_001567f0_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_001567f0_caseD_10;
    }
    CVar17 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
    if (CVar17 != CURLPX_OK) goto LAB_00157b09;
    if (sx->outstanding != 0) {
LAB_00157513:
      CVar17 = CURLPX_OK;
      goto LAB_00157b09;
    }
    if (*puVar1 != '\x05') {
      Curl_failf(data,"Received invalid version in initial SOCKS5 response.");
      goto LAB_00156ea2;
    }
    bVar3 = sx->buffer[1];
    if (1 < bVar3) {
      if (bVar3 == 2) {
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_001567f0_caseD_6:
        pcVar25 = sx->proxy_user;
        if ((pcVar25 == (char *)0x0) || (pcVar5 = sx->proxy_password, pcVar5 == (char *)0x0)) {
          sx->buffer[0] = '\x01';
          sx->buffer[1] = '\0';
          sx->buffer[2] = '\0';
          lVar18 = 3;
          pcVar25 = (char *)0x0;
        }
        else {
          local_98 = sVar19;
          local_90 = pcVar25;
          sVar19 = strlen(pcVar25);
          pcVar25 = (char *)strlen(pcVar5);
          pcVar5 = local_90;
          sx->buffer[0] = '\x01';
          sx->buffer[1] = (uchar)sVar19;
          if (sVar19 != 0) {
            if (0xff < sVar19) {
              Curl_failf(data,"Excessive username length for proxy auth");
              CVar17 = CURLPX_LONG_USER;
              goto LAB_00157b09;
            }
            local_90 = pcVar25;
            memcpy(sx->buffer + 2,pcVar5,sVar19);
            pcVar25 = local_90;
          }
          lVar18 = sVar19 + 3;
          sx->buffer[sVar19 + 2] = (uchar)pcVar25;
          sVar19 = local_98;
          if (pcVar25 != (char *)0x0 && sx->proxy_password != (char *)0x0) {
            if ((char *)0xff < pcVar25) {
              Curl_failf(data,"Excessive password length for proxy auth");
              CVar17 = CURLPX_LONG_PASSWD;
              goto LAB_00157b09;
            }
            memcpy(puVar1 + lVar18,sx->proxy_password,(size_t)pcVar25);
            sVar19 = local_98;
          }
        }
        if (sx->state != CONNECT_AUTH_SEND) {
          sx->state = CONNECT_AUTH_SEND;
        }
        sx->outstanding = (ssize_t)(pcVar25 + lVar18);
        sx->outp = puVar1;
switchD_001567f0_caseD_7:
        CVar17 = socks_state_send(cf->next,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request"
                                 );
        if (CVar17 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            sx->outp = puVar1;
            sx->outstanding = 2;
            if (sx->state != CONNECT_AUTH_READ) {
              sx->state = CONNECT_AUTH_READ;
            }
switchD_001567f0_caseD_8:
            CVar17 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_AUTH,
                                      "SOCKS5 sub-negotiation response");
            if (CVar17 == CURLPX_OK) {
              if (sx->outstanding != 0) goto LAB_00157513;
              if (sx->buffer[1] == '\0') {
                cVar27 = sx->state;
                goto LAB_0015755e;
              }
              Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
              CVar17 = CURLPX_USER_REJECTED;
            }
          }
          else {
            CVar17 = CURLPX_OK;
          }
        }
      }
      else {
        if (bVar3 != 0xff) goto LAB_001572f3;
        Curl_failf(data,"No authentication method was acceptable.");
        CVar17 = CURLPX_NO_AUTH;
      }
      goto LAB_00157b09;
    }
    if (bVar3 != 0) {
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        CVar17 = CURLPX_GSSAPI_PERMSG;
      }
      else {
LAB_001572f3:
        Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
        CVar17 = CURLPX_UNKNOWN_MODE;
      }
      goto LAB_00157b09;
    }
    cVar27 = sx->state;
LAB_0015755e:
    if (cVar27 != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
switchD_001567f0_caseD_9:
    if ((char)local_a0 == '\x05') {
      rVar16 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
      if (rVar16 == CURLRESOLV_ERROR) {
        CVar17 = CURLPX_RESOLVE_HOST;
      }
      else {
        if (rVar16 != CURLRESOLV_PENDING) {
          if (sx->state != CONNECT_RESOLVED) {
            sx->state = CONNECT_RESOLVED;
          }
          pCVar20 = dns;
          if (dns == (Curl_dns_entry *)0x0) {
            pCVar23 = (Curl_addrinfo *)0x0;
          }
          else {
LAB_00157723:
            pCVar23 = pCVar20->addr;
          }
LAB_00157727:
          uVar22 = (data->set).ipver;
          if (uVar22 == '\0') {
            if (pCVar23 != (Curl_addrinfo *)0x0) {
LAB_00157771:
              Curl_printable_address(pCVar23,dest,0x2e);
              sx->buffer[0] = '\x05';
              sx->buffer[1] = '\x01';
              sx->buffer[2] = '\0';
              if (pCVar23->ai_family == 10) {
                sx->buffer[3] = '\x04';
                psVar6 = pCVar23->ai_addr;
                lVar18 = 0;
                do {
                  sx->buffer[lVar18 + 4] = psVar6->sa_data[lVar18 + 6];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x10);
                lVar18 = 0x14;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar7->log_level)))) {
                  uVar14 = sx->remote_port;
                  pcVar25 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_00157891:
                  Curl_infof(data,pcVar25,dest,(ulong)uVar14);
                }
              }
              else if (pCVar23->ai_family == 2) {
                sx->buffer[3] = '\x01';
                psVar6 = pCVar23->ai_addr;
                lVar18 = 0;
                do {
                  sx->buffer[lVar18 + 4] = psVar6->sa_data[lVar18 + 2];
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                lVar18 = 8;
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar7->log_level)))) {
                  uVar14 = sx->remote_port;
                  pcVar25 = "SOCKS5 connect to %s:%d (locally resolved)";
                  goto LAB_00157891;
                }
              }
              else {
                Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
                lVar18 = 3;
              }
              Curl_resolv_unlink(data,&dns);
              goto LAB_001578f3;
            }
          }
          else if (pCVar23 != (Curl_addrinfo *)0x0) {
            do {
              if (pCVar23->ai_family == (uint)(uVar22 != '\x01') * 8 + 2) goto LAB_00157771;
              pCVar23 = pCVar23->ai_next;
            } while (pCVar23 != (Curl_addrinfo *)0x0);
          }
          Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
          goto LAB_00157832;
        }
        CVar17 = CURLPX_OK;
        if (sx->state != CONNECT_RESOLVING) {
          sx->state = CONNECT_RESOLVING;
        }
      }
      goto LAB_00157b09;
    }
    sx->buffer[0] = '\x05';
    sx->buffer[1] = '\x01';
    sx->buffer[2] = '\0';
LAB_0015757d:
    if (((pcVar4->bits).field_0x1 & 4) == 0) {
      iVar15 = inet_pton(2,sx->hostname,ip4);
      if (iVar15 == 1) {
        sx->buffer[3] = '\x01';
        *(uchar (*) [4])(sx->buffer + 4) = ip4;
        lVar18 = 8;
      }
      else {
        sx->buffer[3] = '\x03';
        sx->buffer[4] = (uchar)sVar19;
        memcpy(sx->buffer + 5,sx->hostname,sVar19);
        lVar18 = sVar19 + 5;
      }
    }
    else {
      iVar15 = inet_pton(10,sx->hostname,dest);
      if (iVar15 != 1) {
        CVar17 = CURLPX_BAD_ADDRESS_TYPE;
        goto LAB_00157b09;
      }
      sx->buffer[3] = '\x04';
      *(undefined4 *)(sx->buffer + 4) = dest._0_4_;
      *(undefined4 *)(sx->buffer + 8) = dest._4_4_;
      *(undefined4 *)(sx->buffer + 0xc) = dest._8_4_;
      *(undefined4 *)(sx->buffer + 0x10) = dest._12_4_;
      lVar18 = 0x14;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                 (ulong)(uint)sx->remote_port);
    }
LAB_001578f3:
    sx->buffer[lVar18] = *(uchar *)((long)&sx->remote_port + 1);
    sx->buffer[lVar18 + 1] = (uchar)sx->remote_port;
    sx->outp = puVar1;
    sx->outstanding = lVar18 + 2;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_001567f0_caseD_e:
    CVar17 = socks_state_send(cf->next,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
    if (CVar17 != CURLPX_OK) goto LAB_00157b09;
    if (sx->outstanding == 0) {
      sx->outstanding = 10;
      sx->outp = puVar1;
      if (sx->state != CONNECT_REQ_READ) {
        sx->state = CONNECT_REQ_READ;
      }
switchD_001567f0_caseD_f:
      CVar17 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
      if (CVar17 == CURLPX_OK) {
        if (sx->outstanding != 0) goto LAB_00157b02;
        if (*puVar1 == '\x05') {
          bVar3 = sx->buffer[1];
          if (bVar3 == 0) {
            uVar22 = sx->buffer[3];
            if (uVar22 != '\x01') {
              if (uVar22 == '\x03') {
                if ((ulong)sx->buffer[4] < 4) goto LAB_00157b58;
                lVar18 = (ulong)sx->buffer[4] + 7;
              }
              else {
                lVar18 = 0x16;
                if (uVar22 != '\x04') {
                  Curl_failf(data,"SOCKS5 reply has wrong address type.");
                  CVar17 = CURLPX_BAD_ADDRESS_TYPE;
                  goto LAB_00157b09;
                }
              }
              sx->outstanding = lVar18 + -10;
              sx->outp = sx->buffer + 10;
              if (sx->state != CONNECT_REQ_READ_MORE) {
                sx->state = CONNECT_REQ_READ_MORE;
              }
switchD_001567f0_caseD_10:
              CVar17 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_ADDRESS,
                                        "SOCKS5 connect request address");
              if (CVar17 != CURLPX_OK) goto LAB_00157b09;
              if (sx->outstanding != 0) goto LAB_00157b02;
            }
LAB_00157b58:
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
            if (data != (Curl_easy *)0x0) goto switchD_001567f0_caseD_5;
LAB_00157bc3:
            CVar17 = CURLPX_OK;
          }
          else {
            Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,
                       (ulong)bVar3);
            CVar17 = CURLPX_REPLY_UNASSIGNED;
            if (bVar3 < 9) {
              CVar17 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar3 * 4);
            }
          }
        }
        else {
          Curl_failf(data,"SOCKS5 reply has wrong version, version should be 5.");
          CVar17 = CURLPX_BAD_VERSION;
        }
      }
      goto LAB_00157b09;
    }
    goto LAB_00157b02;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar13 = CURLE_COULDNT_CONNECT;
    goto LAB_00157b4d;
  }
  puVar1 = sx->buffer;
  dns = (Curl_dns_entry *)0x0;
  switch(cVar27) {
  case CONNECT_SOCKS_INIT:
    pcVar4->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((ulong)pcVar4->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_0015699a;
    }
    else {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        pcVar25 = "";
        if (bVar3 == 6) {
          pcVar25 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar25,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_0015699a:
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar15 = sx->remote_port;
    uVar12 = (ushort)iVar15;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar12 << 8 | uVar12 >> 8;
    if (bVar3 == 6) {
      if (sx->state != CONNECT_REQ_INIT) {
        sx->state = CONNECT_REQ_INIT;
      }
      goto switchD_00156706_caseD_9;
    }
    rVar16 = Curl_resolv(data,sx->hostname,iVar15,true,&dns);
    if (rVar16 == CURLRESOLV_ERROR) {
      CVar17 = CURLPX_RESOLVE_HOST;
    }
    else {
      if (rVar16 != CURLRESOLV_PENDING) {
        cVar27 = sx->state;
        goto joined_r0x00156943;
      }
      if (sx->state != CONNECT_RESOLVING) {
        sx->state = CONNECT_RESOLVING;
      }
      CVar17 = CURLPX_OK;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
        CVar17 = CURLPX_OK;
      }
    }
    break;
  default:
    goto switchD_00156706_caseD_2;
  case CONNECT_SOCKS_READ:
    goto switchD_00156706_caseD_4;
  case CONNECT_REQ_INIT:
switchD_00156706_caseD_9:
    sx->buffer[8] = '\0';
    pcVar25 = sx->proxy_user;
    if (pcVar25 != (char *)0x0) {
      sVar19 = strlen(pcVar25);
      if (0xff < sVar19) {
        Curl_failf(data,"Too long SOCKS proxy username");
        CVar17 = CURLPX_LONG_USER;
        break;
      }
      memcpy(sx->buffer + 8,pcVar25,sVar19 + 1);
    }
    sVar19 = strlen((char *)(sx->buffer + 8));
    uVar24 = sVar19 + 9;
    if (bVar3 == 6) {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      local_a0 = sx->hostname;
      sVar19 = strlen(local_a0);
      if ((0xff < sVar19 + 1) || (uVar26 = sVar19 + 1 + uVar24, 599 < uVar26)) {
        Curl_failf(data,"SOCKS4: too long hostname");
        CVar17 = CURLPX_LONG_HOSTNAME;
        break;
      }
      strcpy((char *)(puVar1 + uVar24),local_a0);
      uVar24 = uVar26;
    }
    sx->outp = puVar1;
    sx->outstanding = uVar24;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
  case CONNECT_REQ_SENDING:
    CVar17 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar17 == CURLPX_OK) {
      if (sx->outstanding == 0) {
        sx->outstanding = 8;
        sx->outp = puVar1;
        if (sx->state != CONNECT_SOCKS_READ) {
          sx->state = CONNECT_SOCKS_READ;
        }
switchD_00156706_caseD_4:
        CVar17 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
        if (CVar17 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_00157b02;
          if (sx->state != CONNECT_DONE) {
            sx->state = CONNECT_DONE;
          }
switchD_00156706_caseD_2:
          if (*puVar1 == '\0') {
            switch(sx->buffer[1]) {
            case 'Z':
              CVar17 = CURLPX_OK;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar7->log_level)))) {
                pcVar25 = "";
                if (bVar3 == 6) {
                  pcVar25 = "a";
                }
                Curl_infof(data,"SOCKS4%s request granted.",pcVar25);
                CVar17 = CURLPX_OK;
              }
              break;
            case '[':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5b);
              CVar17 = CURLPX_REQUEST_FAILED;
              break;
            case '\\':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5c);
              CVar17 = CURLPX_IDENTD;
              break;
            case ']':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5d);
              CVar17 = CURLPX_IDENTD_DIFFER;
              break;
            default:
              Curl_failf(data,"cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                         (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
              CVar17 = CURLPX_UNKNOWN_FAIL;
            }
          }
          else {
            Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
LAB_00156ea2:
            CVar17 = CURLPX_BAD_VERSION;
          }
        }
      }
      else {
LAB_00157b02:
        CVar17 = CURLPX_OK;
      }
    }
    break;
  case CONNECT_RESOLVING:
    dns = Curl_fetch_addr(data,sx->hostname,(pcVar4->primary).remote_port);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar13 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        CVar17 = CURLPX_RESOLVE_HOST;
        if (CVar13 == CURLE_OK) {
          CVar17 = CURLPX_OK;
        }
        break;
      }
    }
    else {
      (data->state).async.dns = dns;
      puVar2 = &(data->state).async.field_0x28;
      *puVar2 = *puVar2 | 1;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))))
      {
        Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
      }
      cVar27 = sx->state;
joined_r0x00156943:
      if (cVar27 != CONNECT_RESOLVED) {
        sx->state = CONNECT_RESOLVED;
      }
      if (dns == (Curl_dns_entry *)0x0) goto switchD_00156706_caseD_b;
    }
    for (pCVar23 = dns->addr; pCVar23 != (Curl_addrinfo *)0x0; pCVar23 = pCVar23->ai_next) {
      if (pCVar23->ai_family == 2) {
        Curl_printable_address(pCVar23,dest,0x40);
        psVar6 = pCVar23->ai_addr;
        sx->buffer[4] = psVar6->sa_data[2];
        sx->buffer[5] = psVar6->sa_data[3];
        sx->buffer[6] = psVar6->sa_data[4];
        sx->buffer[7] = psVar6->sa_data[5];
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlink(data,&dns);
        goto switchD_00156706_caseD_9;
      }
    }
    Curl_failf(data,"SOCKS4 connection to %s not supported",sx->hostname);
LAB_00157832:
    CVar17 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_RESOLVED:
switchD_00156706_caseD_b:
    Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",sx->hostname);
    CVar17 = CURLPX_RESOLVE_HOST;
  }
LAB_00157b09:
  if (CVar17 == CURLPX_OK) {
    CVar13 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn,cf->sockindex);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar17;
    CVar13 = CURLE_PROXY;
  }
LAB_00157b4d:
  _Var11 = (_Bool)(cf->field_0x24 & 1);
LAB_0015664f:
  *done = _Var11;
  return CVar13;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}